

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::MaybeLogToStderr
               (LogSeverity severity,char *message,size_t message_len,size_t prefix_len)

{
  char *tag;
  
  if (((int)severity < fLI::FLAGS_stderrthreshold) && (fLB::FLAGS_alsologtostderr != '\x01')) {
    return;
  }
  ColoredWriteToStderr(severity,message,message_len);
  tag = glog_internal_namespace_::ProgramInvocationShortName();
  glog_internal_namespace_::AlsoErrorWrite(severity,tag,message + prefix_len);
  return;
}

Assistant:

inline void LogDestination::MaybeLogToStderr(LogSeverity severity,
                                             const char* message,
                                             size_t message_len,
                                             size_t prefix_len) {
  if ((severity >= FLAGS_stderrthreshold) || FLAGS_alsologtostderr) {
    ColoredWriteToStderr(severity, message, message_len);
    AlsoErrorWrite(severity,
                   glog_internal_namespace_::ProgramInvocationShortName(),
                   message + prefix_len);
  }
}